

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O2

ego_item * lookup_ego_item(char *name,wchar_t tval,wchar_t sval)

{
  poss_item *ppVar1;
  ego_item *peVar2;
  int iVar3;
  poss_item **pppVar4;
  object_kind *poVar5;
  wchar_t i;
  ulong uVar6;
  
  uVar6 = 0;
  do {
    peVar2 = e_info;
    if (z_info->e_max <= uVar6) {
      return (ego_item *)0x0;
    }
    if ((e_info[uVar6].name != (char *)0x0) && (iVar3 = strcmp(name,e_info[uVar6].name), iVar3 == 0)
       ) {
      pppVar4 = &peVar2[uVar6].poss_items;
      while (ppVar1 = *pppVar4, ppVar1 != (poss_item *)0x0) {
        poVar5 = lookup_kind(tval,sval);
        pppVar4 = &ppVar1->next;
        if (poVar5->kidx == ppVar1->kidx) {
          return peVar2 + uVar6;
        }
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

struct ego_item *lookup_ego_item(const char *name, int tval, int sval)
{
	int i;

	/* Look for it */
	for (i = 0; i < z_info->e_max; i++) {
		struct ego_item *ego = &e_info[i];
		struct poss_item *poss_item = ego->poss_items;

		/* Reject nameless and wrong names */
		if (!ego->name) continue;
		if (!streq(name, ego->name)) continue;

		/* Check tval and sval */
		while (poss_item) {
			struct object_kind *kind = lookup_kind(tval, sval);
			if (kind->kidx == poss_item->kidx) {
				return ego;
			}
			poss_item = poss_item->next;
		}
	}

	return NULL;
}